

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::AllocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CObjectType *pot,CObjectAttributes *poa
          ,IPalObject **ppobjNew)

{
  SynchronizationSupport SVar1;
  CSharedMemoryWaitableObject *pCVar2;
  undefined8 in_R9;
  undefined8 uVar3;
  CSharedMemoryObject *pshmobj;
  PAL_ERROR palError;
  IPalObject **ppobjNew_local;
  CObjectAttributes *poa_local;
  CObjectType *pot_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  uVar3 = 0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x99,in_R9,this,0);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pot == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9a,in_R9,this,uVar3);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9b,in_R9,this,uVar3);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (ppobjNew == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x9c,in_R9,this,uVar3);
    fprintf(_stderr,"Expression: NULL != ppobjNew\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  SVar1 = CObjectType::GetSynchronizationSupport(pot);
  if (SVar1 == WaitableObject) {
    pCVar2 = InternalNew<CorUnix::CSharedMemoryWaitableObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
                       (pot,&this->m_csListLock);
  }
  else {
    pCVar2 = (CSharedMemoryWaitableObject *)
             InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
                       (pot,&this->m_csListLock);
  }
  if (pCVar2 == (CSharedMemoryWaitableObject *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pshmobj._4_4_ = 0xe;
  }
  else {
    pshmobj._4_4_ =
         (*(pCVar2->super_CSharedMemoryObject).super_CPalObjectBase.super_IPalObject.
           _vptr_IPalObject[0xf])(pCVar2,pthr,poa);
    if (pshmobj._4_4_ == 0) {
      *ppobjNew = (IPalObject *)pCVar2;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pshmobj._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::AllocateObject(
    CPalThread *pthr,
    CObjectType *pot,
    CObjectAttributes *poa,
    IPalObject **ppobjNew            // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pot);
    _ASSERTE(NULL != poa);
    _ASSERTE(NULL != ppobjNew);

    ENTRY("CSharedMemoryObjectManager::AllocateObject "
        "(this=%p, pthr=%p, pot=%p, poa=%p, ppobjNew=%p)\n",
        this,
        pthr,
        pot,
        poa,
        ppobjNew
        );

    if (CObjectType::WaitableObject == pot->GetSynchronizationSupport())
    {
        pshmobj = InternalNew<CSharedMemoryWaitableObject>(pot, &m_csListLock);
    }
    else
    {
        pshmobj = InternalNew<CSharedMemoryObject>(pot, &m_csListLock);
    }

    if (NULL != pshmobj)
    {
        palError = pshmobj->Initialize(pthr, poa);
        if (NO_ERROR == palError)
        {
            *ppobjNew = static_cast<IPalObject*>(pshmobj);
        }
    }
    else
    {
        ERROR("Unable to allocate pshmobj\n");
        palError = ERROR_OUTOFMEMORY;
    }

    LOGEXIT("CSharedMemoryObjectManager::AllocateObject returns %d\n", palError);
    return palError;
}